

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTreeEdge.cpp
# Opt level: O2

void __thiscall
PhyloTreeEdge::PhyloTreeEdge
          (PhyloTreeEdge *this,double attrib,shared_ptr<Bipartition> *originalEdge,int originalID)

{
  size_t num_bits;
  allocator<unsigned_long> local_41;
  double local_40;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  
  local_40 = attrib;
  Bipartition::Bipartition(&this->super_Bipartition);
  (this->super_Bipartition)._vptr_Bipartition = (_func_int **)&PTR_toString_abi_cxx11__00146b08;
  this->length = local_40;
  std::__shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->originalEdge).super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>,
             &originalEdge->super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>);
  this->originalID = originalID;
  num_bits = Bipartition::size((originalEdge->
                               super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (&local_38,num_bits,0,&local_41);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&(this->super_Bipartition).partition,&local_38);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset(&local_38);
  return;
}

Assistant:

PhyloTreeEdge::PhyloTreeEdge(double attrib, const shared_ptr<Bipartition>& originalEdge, int originalID) : originalEdge(originalEdge), originalID(originalID), length(attrib) {
    this->partition = boost::dynamic_bitset<>(originalEdge->size());
}